

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O3

bool leveldb::GetLengthPrefixedSlice(Slice *input,Slice *result)

{
  char *pcVar1;
  bool bVar2;
  undefined8 in_RAX;
  ulong uVar3;
  uint32_t len;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  bVar2 = GetVarint32(input,&local_14);
  if ((bVar2) && (uVar3 = (ulong)local_14, uVar3 <= input->size_)) {
    pcVar1 = input->data_;
    result->data_ = pcVar1;
    result->size_ = uVar3;
    if (input->size_ < uVar3) {
      __assert_fail("n <= size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/include/leveldb/slice.h"
                    ,0x45,"void leveldb::Slice::remove_prefix(size_t)");
    }
    input->data_ = pcVar1 + uVar3;
    input->size_ = input->size_ - uVar3;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool GetLengthPrefixedSlice(Slice* input, Slice* result) {
  uint32_t len;
  if (GetVarint32(input, &len) && input->size() >= len) {
    *result = Slice(input->data(), len);
    input->remove_prefix(len);
    return true;
  } else {
    return false;
  }
}